

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressSequences_internal
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,void *dst,
                 size_t dstCapacity,void *workspace,size_t wkspSize,int bmi2)

{
  ZSTD_strategy strategy_00;
  uint uVar1;
  uint uVar2;
  size_t mostFrequent_00;
  uint uVar3;
  bool local_239;
  size_t bitstreamSize;
  size_t countSize_2;
  size_t mostFrequent_2;
  seqStore_t *psStack_218;
  uint max_2;
  size_t countSize_1;
  size_t sStack_208;
  ZSTD_defaultPolicy_e defaultPolicy;
  size_t mostFrequent_1;
  seqStore_t *psStack_1f8;
  uint max_1;
  size_t countSize;
  size_t mostFrequent;
  seqStore_t *psStack_1e0;
  uint max;
  size_t cSize;
  size_t sStack_1d0;
  int disableLiteralCompression;
  size_t litSize;
  BYTE *literals;
  BYTE *lastNCount;
  BYTE *seqHead;
  size_t nbSeq;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  BYTE *mlCodeTable;
  BYTE *llCodeTable;
  BYTE *ofCodeTable;
  seqDef *sequences;
  symbolEncodingType_e local_168;
  U32 MLtype;
  U32 Offtype;
  U32 LLtype;
  FSE_CTable *CTable_MatchLength;
  FSE_CTable *CTable_OffsetBits;
  FSE_CTable *CTable_LitLength;
  uint count [53];
  ZSTD_strategy strategy;
  int longOffsets;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx_params *cctxParams_local;
  ZSTD_entropyCTables_t *nextEntropy_local;
  ZSTD_entropyCTables_t *prevEntropy_local;
  seqStore_t *seqStorePtr_local;
  
  uVar2 = (cctxParams->cParams).windowLog;
  uVar1 = MEM_32bits();
  uVar3 = 0x39;
  if (uVar1 != 0) {
    uVar3 = 0x19;
  }
  strategy_00 = (cctxParams->cParams).strategy;
  CTable_OffsetBits = (nextEntropy->fse).litlengthCTable;
  CTable_MatchLength = (nextEntropy->fse).offcodeCTable;
  _Offtype = (nextEntropy->fse).matchlengthCTable;
  ofCodeTable = (BYTE *)seqStorePtr->sequencesStart;
  llCodeTable = seqStorePtr->ofCode;
  mlCodeTable = seqStorePtr->llCode;
  ostart = seqStorePtr->mlCode;
  op = (BYTE *)((long)dst + dstCapacity);
  seqHead = (BYTE *)((long)seqStorePtr->sequences - (long)seqStorePtr->sequencesStart >> 3);
  literals = (BYTE *)0x0;
  litSize = (size_t)seqStorePtr->litStart;
  sStack_1d0 = (long)seqStorePtr->lit - litSize;
  local_239 = false;
  if ((cctxParams->cParams).strategy == ZSTD_fast) {
    local_239 = (cctxParams->cParams).targetLength != 0;
  }
  cSize._4_4_ = (uint)local_239;
  nbSeq = (size_t)dst;
  oend = (BYTE *)dst;
  psStack_1e0 = (seqStore_t *)
                ZSTD_compressLiterals
                          (&prevEntropy->huf,&nextEntropy->huf,(cctxParams->cParams).strategy,
                           cSize._4_4_,dst,dstCapacity,(void *)litSize,sStack_1d0,workspace,wkspSize
                           ,bmi2);
  uVar1 = ERR_isError((size_t)psStack_1e0);
  if (uVar1 == 0) {
    nbSeq = (long)&psStack_1e0->sequencesStart + nbSeq;
    if ((long)((long)op - nbSeq) < 4) {
      seqStorePtr_local = (seqStore_t *)0xffffffffffffffba;
    }
    else {
      if (seqHead < (BYTE *)0x7f) {
        *(char *)nbSeq = (char)seqHead;
        nbSeq = (size_t)(nbSeq + 1);
      }
      else if (seqHead < (BYTE *)0x7f00) {
        *(char *)nbSeq = (char)((ulong)seqHead >> 8) + -0x80;
        *(char *)(nbSeq + 1) = (char)seqHead;
        nbSeq = nbSeq + 2;
      }
      else {
        *(char *)nbSeq = -1;
        MEM_writeLE16((char *)(nbSeq + 1),(short)seqHead + 0x8100);
        nbSeq = nbSeq + 3;
      }
      if (seqHead == (BYTE *)0x0) {
        memcpy(&nextEntropy->fse,&prevEntropy->fse,0xde0);
        seqStorePtr_local = (seqStore_t *)(nbSeq - (long)oend);
      }
      else {
        lastNCount = (BYTE *)nbSeq;
        nbSeq = nbSeq + 1;
        ZSTD_seqToCodes(seqStorePtr);
        mostFrequent._4_4_ = 0x23;
        countSize = HIST_countFast_wksp((uint *)&CTable_LitLength,(uint *)((long)&mostFrequent + 4),
                                        mlCodeTable,(size_t)seqHead,workspace,wkspSize);
        (nextEntropy->fse).litlength_repeatMode = (prevEntropy->fse).litlength_repeatMode;
        MLtype = ZSTD_selectEncodingType
                           (&(nextEntropy->fse).litlength_repeatMode,(uint *)&CTable_LitLength,
                            mostFrequent._4_4_,countSize,(size_t)seqHead,9,
                            (prevEntropy->fse).litlengthCTable,LL_defaultNorm,6,ZSTD_defaultAllowed,
                            strategy_00);
        psStack_1f8 = (seqStore_t *)
                      ZSTD_buildCTable((void *)nbSeq,(long)op - nbSeq,CTable_OffsetBits,9,MLtype,
                                       (uint *)&CTable_LitLength,mostFrequent._4_4_,mlCodeTable,
                                       (size_t)seqHead,LL_defaultNorm,6,0x23,
                                       (prevEntropy->fse).litlengthCTable,0x524,workspace,wkspSize);
        uVar1 = ERR_isError((size_t)psStack_1f8);
        if (uVar1 == 0) {
          if (MLtype == 2) {
            literals = (BYTE *)nbSeq;
          }
          nbSeq = (long)&psStack_1f8->sequencesStart + nbSeq;
          mostFrequent_1._4_4_ = 0x1f;
          sStack_208 = HIST_countFast_wksp((uint *)&CTable_LitLength,
                                           (uint *)((long)&mostFrequent_1 + 4),llCodeTable,
                                           (size_t)seqHead,workspace,wkspSize);
          countSize_1._4_4_ = (ZSTD_defaultPolicy_e)(mostFrequent_1._4_4_ < 0x1d);
          (nextEntropy->fse).offcode_repeatMode = (prevEntropy->fse).offcode_repeatMode;
          local_168 = ZSTD_selectEncodingType
                                (&(nextEntropy->fse).offcode_repeatMode,(uint *)&CTable_LitLength,
                                 mostFrequent_1._4_4_,sStack_208,(size_t)seqHead,8,
                                 (prevEntropy->fse).offcodeCTable,OF_defaultNorm,5,countSize_1._4_4_
                                 ,strategy_00);
          psStack_218 = (seqStore_t *)
                        ZSTD_buildCTable((void *)nbSeq,(long)op - nbSeq,CTable_MatchLength,8,
                                         local_168,(uint *)&CTable_LitLength,mostFrequent_1._4_4_,
                                         llCodeTable,(size_t)seqHead,OF_defaultNorm,5,0x1c,
                                         (prevEntropy->fse).offcodeCTable,0x304,workspace,wkspSize);
          uVar1 = ERR_isError((size_t)psStack_218);
          if (uVar1 == 0) {
            if (local_168 == set_compressed) {
              literals = (BYTE *)nbSeq;
            }
            nbSeq = (long)&psStack_218->sequencesStart + nbSeq;
            mostFrequent_2._4_4_ = 0x34;
            mostFrequent_00 =
                 HIST_countFast_wksp((uint *)&CTable_LitLength,(uint *)((long)&mostFrequent_2 + 4),
                                     ostart,(size_t)seqHead,workspace,wkspSize);
            (nextEntropy->fse).matchlength_repeatMode = (prevEntropy->fse).matchlength_repeatMode;
            sequences._4_4_ =
                 ZSTD_selectEncodingType
                           (&(nextEntropy->fse).matchlength_repeatMode,(uint *)&CTable_LitLength,
                            mostFrequent_2._4_4_,mostFrequent_00,(size_t)seqHead,9,
                            (prevEntropy->fse).matchlengthCTable,ML_defaultNorm,6,
                            ZSTD_defaultAllowed,strategy_00);
            seqStorePtr_local =
                 (seqStore_t *)
                 ZSTD_buildCTable((void *)nbSeq,(long)op - nbSeq,_Offtype,9,sequences._4_4_,
                                  (uint *)&CTable_LitLength,mostFrequent_2._4_4_,ostart,
                                  (size_t)seqHead,ML_defaultNorm,6,0x34,
                                  (prevEntropy->fse).matchlengthCTable,0x5ac,workspace,wkspSize);
            uVar1 = ERR_isError((size_t)seqStorePtr_local);
            if (uVar1 == 0) {
              if (sequences._4_4_ == set_compressed) {
                literals = (BYTE *)nbSeq;
              }
              nbSeq = (long)&seqStorePtr_local->sequencesStart + nbSeq;
              *lastNCount = (char)(MLtype << 6) + (char)(local_168 << 4) +
                            (char)(sequences._4_4_ << 2);
              seqStorePtr_local =
                   (seqStore_t *)
                   ZSTD_encodeSequences
                             ((void *)nbSeq,(long)op - nbSeq,_Offtype,ostart,CTable_MatchLength,
                              llCodeTable,CTable_OffsetBits,mlCodeTable,(seqDef *)ofCodeTable,
                              (size_t)seqHead,(uint)(uVar3 < uVar2),bmi2);
              uVar2 = ERR_isError((size_t)seqStorePtr_local);
              if (uVar2 == 0) {
                if ((literals == (BYTE *)0x0) ||
                   (3 < (long)((long)seqStorePtr_local + (nbSeq - (long)literals)))) {
                  seqStorePtr_local = (seqStore_t *)((long)seqStorePtr_local + (nbSeq - (long)oend))
                  ;
                }
                else {
                  seqStorePtr_local = (seqStore_t *)0x0;
                }
              }
            }
          }
          else {
            seqStorePtr_local = psStack_218;
          }
        }
        else {
          seqStorePtr_local = psStack_1f8;
        }
      }
    }
  }
  else {
    seqStorePtr_local = psStack_1e0;
  }
  return (size_t)seqStorePtr_local;
}

Assistant:

MEM_STATIC size_t
ZSTD_compressSequences_internal(seqStore_t* seqStorePtr,
                          const ZSTD_entropyCTables_t* prevEntropy,
                                ZSTD_entropyCTables_t* nextEntropy,
                          const ZSTD_CCtx_params* cctxParams,
                                void* dst, size_t dstCapacity,
                                void* workspace, size_t wkspSize,
                          const int bmi2)
{
    const int longOffsets = cctxParams->cParams.windowLog > STREAM_ACCUMULATOR_MIN;
    ZSTD_strategy const strategy = cctxParams->cParams.strategy;
    unsigned count[MaxSeq+1];
    FSE_CTable* CTable_LitLength = nextEntropy->fse.litlengthCTable;
    FSE_CTable* CTable_OffsetBits = nextEntropy->fse.offcodeCTable;
    FSE_CTable* CTable_MatchLength = nextEntropy->fse.matchlengthCTable;
    U32 LLtype, Offtype, MLtype;   /* compressed, raw or rle */
    const seqDef* const sequences = seqStorePtr->sequencesStart;
    const BYTE* const ofCodeTable = seqStorePtr->ofCode;
    const BYTE* const llCodeTable = seqStorePtr->llCode;
    const BYTE* const mlCodeTable = seqStorePtr->mlCode;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstCapacity;
    BYTE* op = ostart;
    size_t const nbSeq = seqStorePtr->sequences - seqStorePtr->sequencesStart;
    BYTE* seqHead;
    BYTE* lastNCount = NULL;

    ZSTD_STATIC_ASSERT(HUF_WORKSPACE_SIZE >= (1<<MAX(MLFSELog,LLFSELog)));
    DEBUGLOG(5, "ZSTD_compressSequences_internal");

    /* Compress literals */
    {   const BYTE* const literals = seqStorePtr->litStart;
        size_t const litSize = seqStorePtr->lit - literals;
        int const disableLiteralCompression = (cctxParams->cParams.strategy == ZSTD_fast) && (cctxParams->cParams.targetLength > 0);
        size_t const cSize = ZSTD_compressLiterals(
                                    &prevEntropy->huf, &nextEntropy->huf,
                                    cctxParams->cParams.strategy, disableLiteralCompression,
                                    op, dstCapacity,
                                    literals, litSize,
                                    workspace, wkspSize,
                                    bmi2);
        if (ZSTD_isError(cSize))
          return cSize;
        assert(cSize <= dstCapacity);
        op += cSize;
    }

    /* Sequences Header */
    if ((oend-op) < 3 /*max nbSeq Size*/ + 1 /*seqHead*/) return ERROR(dstSize_tooSmall);
    if (nbSeq < 0x7F)
        *op++ = (BYTE)nbSeq;
    else if (nbSeq < LONGNBSEQ)
        op[0] = (BYTE)((nbSeq>>8) + 0x80), op[1] = (BYTE)nbSeq, op+=2;
    else
        op[0]=0xFF, MEM_writeLE16(op+1, (U16)(nbSeq - LONGNBSEQ)), op+=3;
    if (nbSeq==0) {
        /* Copy the old tables over as if we repeated them */
        memcpy(&nextEntropy->fse, &prevEntropy->fse, sizeof(prevEntropy->fse));
        return op - ostart;
    }

    /* seqHead : flags for FSE encoding type */
    seqHead = op++;

    /* convert length/distances into codes */
    ZSTD_seqToCodes(seqStorePtr);
    /* build CTable for Literal Lengths */
    {   unsigned max = MaxLL;
        size_t const mostFrequent = HIST_countFast_wksp(count, &max, llCodeTable, nbSeq, workspace, wkspSize);   /* can't fail */
        DEBUGLOG(5, "Building LL table");
        nextEntropy->fse.litlength_repeatMode = prevEntropy->fse.litlength_repeatMode;
        LLtype = ZSTD_selectEncodingType(&nextEntropy->fse.litlength_repeatMode,
                                        count, max, mostFrequent, nbSeq,
                                        LLFSELog, prevEntropy->fse.litlengthCTable,
                                        LL_defaultNorm, LL_defaultNormLog,
                                        ZSTD_defaultAllowed, strategy);
        assert(set_basic < set_compressed && set_rle < set_compressed);
        assert(!(LLtype < set_compressed && nextEntropy->fse.litlength_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(op, oend - op, CTable_LitLength, LLFSELog, (symbolEncodingType_e)LLtype,
                                                    count, max, llCodeTable, nbSeq, LL_defaultNorm, LL_defaultNormLog, MaxLL,
                                                    prevEntropy->fse.litlengthCTable, sizeof(prevEntropy->fse.litlengthCTable),
                                                    workspace, wkspSize);
            if (ZSTD_isError(countSize)) return countSize;
            if (LLtype == set_compressed)
                lastNCount = op;
            op += countSize;
    }   }
    /* build CTable for Offsets */
    {   unsigned max = MaxOff;
        size_t const mostFrequent = HIST_countFast_wksp(count, &max, ofCodeTable, nbSeq, workspace, wkspSize);  /* can't fail */
        /* We can only use the basic table if max <= DefaultMaxOff, otherwise the offsets are too large */
        ZSTD_defaultPolicy_e const defaultPolicy = (max <= DefaultMaxOff) ? ZSTD_defaultAllowed : ZSTD_defaultDisallowed;
        DEBUGLOG(5, "Building OF table");
        nextEntropy->fse.offcode_repeatMode = prevEntropy->fse.offcode_repeatMode;
        Offtype = ZSTD_selectEncodingType(&nextEntropy->fse.offcode_repeatMode,
                                        count, max, mostFrequent, nbSeq,
                                        OffFSELog, prevEntropy->fse.offcodeCTable,
                                        OF_defaultNorm, OF_defaultNormLog,
                                        defaultPolicy, strategy);
        assert(!(Offtype < set_compressed && nextEntropy->fse.offcode_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(op, oend - op, CTable_OffsetBits, OffFSELog, (symbolEncodingType_e)Offtype,
                                                    count, max, ofCodeTable, nbSeq, OF_defaultNorm, OF_defaultNormLog, DefaultMaxOff,
                                                    prevEntropy->fse.offcodeCTable, sizeof(prevEntropy->fse.offcodeCTable),
                                                    workspace, wkspSize);
            if (ZSTD_isError(countSize)) return countSize;
            if (Offtype == set_compressed)
                lastNCount = op;
            op += countSize;
    }   }
    /* build CTable for MatchLengths */
    {   unsigned max = MaxML;
        size_t const mostFrequent = HIST_countFast_wksp(count, &max, mlCodeTable, nbSeq, workspace, wkspSize);   /* can't fail */
        DEBUGLOG(5, "Building ML table (remaining space : %i)", (int)(oend-op));
        nextEntropy->fse.matchlength_repeatMode = prevEntropy->fse.matchlength_repeatMode;
        MLtype = ZSTD_selectEncodingType(&nextEntropy->fse.matchlength_repeatMode,
                                        count, max, mostFrequent, nbSeq,
                                        MLFSELog, prevEntropy->fse.matchlengthCTable,
                                        ML_defaultNorm, ML_defaultNormLog,
                                        ZSTD_defaultAllowed, strategy);
        assert(!(MLtype < set_compressed && nextEntropy->fse.matchlength_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(op, oend - op, CTable_MatchLength, MLFSELog, (symbolEncodingType_e)MLtype,
                                                    count, max, mlCodeTable, nbSeq, ML_defaultNorm, ML_defaultNormLog, MaxML,
                                                    prevEntropy->fse.matchlengthCTable, sizeof(prevEntropy->fse.matchlengthCTable),
                                                    workspace, wkspSize);
            if (ZSTD_isError(countSize)) return countSize;
            if (MLtype == set_compressed)
                lastNCount = op;
            op += countSize;
    }   }

    *seqHead = (BYTE)((LLtype<<6) + (Offtype<<4) + (MLtype<<2));

    {   size_t const bitstreamSize = ZSTD_encodeSequences(
                                        op, oend - op,
                                        CTable_MatchLength, mlCodeTable,
                                        CTable_OffsetBits, ofCodeTable,
                                        CTable_LitLength, llCodeTable,
                                        sequences, nbSeq,
                                        longOffsets, bmi2);
        if (ZSTD_isError(bitstreamSize)) return bitstreamSize;
        op += bitstreamSize;
        /* zstd versions <= 1.3.4 mistakenly report corruption when
         * FSE_readNCount() recieves a buffer < 4 bytes.
         * Fixed by https://github.com/facebook/zstd/pull/1146.
         * This can happen when the last set_compressed table present is 2
         * bytes and the bitstream is only one byte.
         * In this exceedingly rare case, we will simply emit an uncompressed
         * block, since it isn't worth optimizing.
         */
        if (lastNCount && (op - lastNCount) < 4) {
            /* NCountSize >= 2 && bitstreamSize > 0 ==> lastCountSize == 3 */
            assert(op - lastNCount == 3);
            DEBUGLOG(5, "Avoiding bug in zstd decoder in versions <= 1.3.4 by "
                        "emitting an uncompressed block.");
            return 0;
        }
    }

    DEBUGLOG(5, "compressed block size : %u", (unsigned)(op - ostart));
    return op - ostart;
}